

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcSetLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,int iLit)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int ObjNum;
  Vec_Int_t *vFrame;
  int iLit_local;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 != 0) {
    piVar2 = Saig_ManBmcMapping(p,pObj);
    if (piVar2 == (int *)0x0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x366,"int Saig_ManBmcSetLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int, int)");
    }
  }
  pVVar3 = p->vId2Num;
  iVar1 = Aig_ObjId(pObj);
  iVar1 = Vec_IntEntry(pVVar3,iVar1);
  pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p->vId2Var,iFrame);
  Vec_IntWriteEntry(pVVar3,iVar1,iLit);
  return iLit;
}

Assistant:

static inline int Saig_ManBmcSetLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, int iLit )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    Vec_IntWriteEntry( vFrame, ObjNum, iLit );
/*
    if ( Vec_IntEntry( p->vMapRefs, Aig_ObjId(pObj) ) > 1 )
        p->nLitUsed++;
    else
        p->nLitUseless++;
*/
    return iLit;
}